

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  Ch *pCVar2;
  Ch *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar12;
  byte *pbVar13;
  byte bVar14;
  uint16_t uVar15;
  undefined4 uVar16;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  SizeType SVar20;
  int iVar21;
  ulong uVar22;
  byte *pbVar23;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined8 uVar30;
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  double dVar32;
  undefined1 auVar33 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  bVar14 = *is->src_;
  if (bVar14 < 0x6e) {
    if (bVar14 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar14 != 0x5b) {
      if (bVar14 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pCVar2 = is->src_;
      if (*pCVar2 == 'f') {
        is->src_ = pCVar2 + 1;
        if ((((pCVar2[1] == 'a') && (is->src_ = pCVar2 + 2, pCVar2[2] == 'l')) &&
            (is->src_ = pCVar2 + 3, pCVar2[3] == 's')) && (is->src_ = pCVar2 + 4, pCVar2[4] == 'e'))
        {
          is->src_ = pCVar2 + 5;
          pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar12->data_).n = (Number)0x0;
          (pGVar12->data_).s.str = (Ch *)0x0;
          (pGVar12->data_).f.flags = 9;
        }
        else {
          ParseFalse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
        }
        return;
      }
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x371,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar12->data_).n = (Number)0x0;
    (pGVar12->data_).s.str = (Ch *)0x0;
    (pGVar12->data_).f.flags = 4;
    pbVar13 = is->src_;
    while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
      pbVar13 = pbVar13 + 1;
    }
    is->src_ = pbVar13;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar13 == 0x5d) {
        is->src_ = pbVar13 + 1;
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (!bVar10) {
          ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this + 0x30);
LAB_00102076:
          uVar16 = 0x10;
LAB_0010207b:
          pCVar2 = is->src_;
          pCVar3 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar16;
          *(long *)(this + 0x38) = (long)pCVar2 - (long)pCVar3;
        }
      }
      else {
        ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) == 0) {
          SVar20 = 0;
          do {
            pbVar13 = is->src_;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            SVar20 = SVar20 + 1;
            is->src_ = pbVar13;
            if (*pbVar13 != 0x2c) {
              if (*is->src_ != ']') {
                uVar16 = 7;
                goto LAB_0010207b;
              }
              is->src_ = is->src_ + 1;
              bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndArray(handler,SVar20);
              if (bVar10) {
                return;
              }
              ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                        (this + 0x30);
              goto LAB_00102076;
            }
            pbVar13 = pbVar13 + 1;
            is->src_ = pbVar13;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            is->src_ = pbVar13;
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
          } while (*(int *)(this + 0x30) == 0);
        }
      }
    }
    return;
  }
  if (bVar14 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar12->data_).n = (Number)0x0;
    (pGVar12->data_).s.str = (Ch *)0x0;
    (pGVar12->data_).f.flags = 3;
    pbVar13 = is->src_;
    while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
      pbVar13 = pbVar13 + 1;
    }
    is->src_ = pbVar13;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar13 == 0x7d) {
        is->src_ = pbVar13 + 1;
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar10) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x2ee,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_00101ec2:
        pbVar13 = is->src_;
        uVar16 = 0x10;
      }
      else {
        pbVar13 = is->src_;
        if (*pbVar13 == 0x22) {
          SVar20 = 0;
          do {
            ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar13 = is->src_;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            is->src_ = pbVar13;
            if (*pbVar13 != 0x3a) {
              pbVar13 = is->src_;
              uVar16 = 5;
              goto LAB_00101f13;
            }
            pbVar13 = pbVar13 + 1;
            is->src_ = pbVar13;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            is->src_ = pbVar13;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar13 = is->src_;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            is->src_ = pbVar13;
            SVar20 = SVar20 + 1;
            if (*pbVar13 != 0x2c) {
              if (*pbVar13 != 0x7d) {
                uVar16 = 6;
                goto LAB_00101f13;
              }
              is->src_ = pbVar13 + 1;
              bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndObject(handler,SVar20);
              if (bVar10) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                              ,0x313,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_00101ec2;
            }
            pbVar13 = pbVar13 + 1;
            is->src_ = pbVar13;
            while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))
                  ) {
              pbVar13 = pbVar13 + 1;
            }
            is->src_ = pbVar13;
          } while (*pbVar13 == 0x22);
        }
        uVar16 = 4;
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x2f4,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
LAB_00101f13:
      pCVar2 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar16;
      *(long *)(this + 0x38) = (long)pbVar13 - (long)pCVar2;
    }
    return;
  }
  if (bVar14 == 0x74) {
    pCVar2 = is->src_;
    if (*pCVar2 == 't') {
      is->src_ = pCVar2 + 1;
      if (((pCVar2[1] == 'r') && (is->src_ = pCVar2 + 2, pCVar2[2] == 'u')) &&
         (is->src_ = pCVar2 + 3, pCVar2[3] == 'e')) {
        is->src_ = pCVar2 + 4;
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).n = (Number)0x0;
        (pGVar12->data_).s.str = (Ch *)0x0;
        (pGVar12->data_).f.flags = 10;
      }
      else {
        ParseTrue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
      }
      return;
    }
    __assert_fail("is.Peek() == \'t\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x364,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar14 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pCVar2 = is->src_;
  pCVar3 = is->head_;
  CVar1 = *pCVar2;
  pbVar13 = pCVar2 + (CVar1 == '-');
  bVar14 = pCVar2[CVar1 == '-'];
  if (bVar14 == 0x30) {
    pbVar23 = pbVar13 + 1;
    bVar10 = false;
    iVar11 = 0;
    uVar24 = 0;
    uVar25 = 0;
    goto LAB_001021d4;
  }
  if ((byte)(bVar14 - 0x31) < 9) {
    uVar25 = bVar14 - 0x30;
    bVar14 = pbVar13[1];
    pbVar23 = pbVar13 + 1;
    if (CVar1 == '-') {
      if ((byte)(bVar14 - 0x30) < 10) {
        iVar11 = 0;
        do {
          if ((0xccccccb < uVar25) && (0x38 < bVar14 || uVar25 != 0xccccccc)) goto LAB_001021ca;
          uVar25 = (bVar14 - 0x30) + uVar25 * 10;
          iVar11 = iVar11 + 1;
          bVar14 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while ((byte)(bVar14 - 0x30) < 10);
      }
      else {
LAB_001028c1:
        iVar11 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar14 - 0x30)) goto LAB_001028c1;
      iVar11 = 0;
      do {
        if ((0x19999998 < uVar25) && (0x35 < bVar14 || uVar25 != 0x19999999)) goto LAB_001021ca;
        uVar25 = (bVar14 - 0x30) + uVar25 * 10;
        iVar11 = iVar11 + 1;
        bVar14 = pbVar23[1];
        pbVar23 = pbVar23 + 1;
      } while ((byte)(bVar14 - 0x30) < 10);
    }
    bVar10 = false;
    uVar24 = 0;
    goto LAB_001021d4;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar19 = (long)pbVar13 - (long)pCVar3;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_001028d3;
LAB_001021ca:
  bVar10 = true;
  uVar24 = uVar25;
LAB_001021d4:
  uVar22 = (ulong)uVar24;
  auVar28 = ZEXT816(0) << 0x40;
  if (bVar10) {
    bVar14 = *pbVar23;
    bVar18 = bVar14 - 0x30;
    if (CVar1 == '-') {
      while (bVar18 < 10) {
        if ((0xccccccccccccccb < uVar22) && (uVar22 != 0xccccccccccccccc || 0x38 < bVar14))
        goto LAB_0010229f;
        uVar22 = (ulong)(bVar14 & 0xf) + uVar22 * 10;
        iVar11 = iVar11 + 1;
        bVar14 = pbVar23[1];
        pbVar23 = pbVar23 + 1;
        bVar18 = bVar14 - 0x30;
      }
    }
    else {
      while (bVar18 < 10) {
        if ((0x1999999999999998 < uVar22) && (uVar22 != 0x1999999999999999 || 0x35 < bVar14))
        goto LAB_0010229f;
        uVar22 = (ulong)(bVar14 & 0xf) + uVar22 * 10;
        iVar11 = iVar11 + 1;
        bVar14 = pbVar23[1];
        pbVar23 = pbVar23 + 1;
        bVar18 = bVar14 - 0x30;
      }
    }
  }
  bVar7 = false;
  goto LAB_001022ac;
LAB_0010229f:
  auVar28 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,uVar22);
  bVar7 = true;
LAB_001022ac:
  auVar33 = ZEXT1664(auVar28);
  if ((bVar7) && (bVar14 = *pbVar23, (byte)(bVar14 - 0x30) < 10)) {
    do {
      auVar28._0_8_ = (double)(int)(bVar14 - 0x30);
      auVar28._8_8_ = in_ZMM2._8_8_;
      auVar28 = vfmadd132sd_fma(auVar33._0_16_,auVar28,ZEXT816(0x4024000000000000));
      auVar33 = ZEXT1664(auVar28);
      bVar14 = pbVar23[1];
      pbVar23 = pbVar23 + 1;
    } while ((byte)(bVar14 - 0x30) < 10);
  }
  auVar27 = auVar33._0_16_;
  pbVar13 = pbVar23 + (*pbVar23 == 0x2e);
  iVar21 = 0;
  uVar17 = uVar22;
  if (*pbVar23 == 0x2e) {
    if (0xf5 < (byte)(*pbVar13 - 0x3a)) {
      iVar21 = 0;
      if (!bVar7) {
        uVar17 = (ulong)uVar25;
        if (bVar10) {
          uVar17 = uVar22;
        }
        bVar14 = *pbVar13;
        iVar21 = 0;
        if ((0xf5 < (byte)(bVar14 - 0x3a)) && (iVar21 = 0, uVar17 < 0x20000000000000)) {
          lVar19 = 0;
          do {
            uVar17 = (ulong)(bVar14 & 0xf) + uVar17 * 10;
            iVar11 = (uint)(uVar17 != 0) + iVar11;
            bVar14 = pbVar13[lVar19 + 1];
            lVar19 = lVar19 + 1;
            if ((byte)(bVar14 - 0x3a) < 0xf6) break;
          } while (uVar17 < 0x20000000000000);
          iVar21 = -(int)lVar19;
          pbVar13 = pbVar13 + lVar19;
        }
        auVar28 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar17);
        auVar33 = ZEXT1664(auVar28);
        bVar7 = true;
      }
      auVar27 = auVar33._0_16_;
      bVar14 = *pbVar13;
      if ((byte)(bVar14 - 0x30) < 10) {
        do {
          if (iVar11 < 0x11) {
            auVar31._0_8_ = (double)(int)(bVar14 - 0x30);
            auVar31._8_8_ = in_XMM4_Qb;
            auVar28 = vfmadd231sd_fma(auVar31,auVar33._0_16_,ZEXT816(0x4024000000000000));
            iVar21 = iVar21 + -1;
            if (0.0 < auVar28._0_8_) {
              iVar11 = iVar11 + 1;
            }
            auVar33 = ZEXT1664(auVar28);
          }
          auVar27 = auVar33._0_16_;
          bVar14 = pbVar13[1];
          pbVar13 = pbVar13 + 1;
        } while ((byte)(bVar14 - 0x30) < 10);
      }
      goto LAB_001023df;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x627,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar19 = (long)pbVar13 - (long)pCVar3;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
LAB_001023df:
    lVar19 = (long)pCVar2 - (long)pCVar3;
    bVar14 = *pbVar13;
    pbVar13 = pbVar13 + (bVar14 == 0x65);
    if (bVar14 == 0x65) {
LAB_0010241d:
      uVar22 = (ulong)uVar25;
      if (bVar10) {
        uVar22 = uVar17;
      }
      bVar8 = true;
      if (bVar7) {
        bVar8 = bVar7;
      }
      bVar14 = *pbVar13;
      pbVar13 = pbVar13 + (bVar14 == 0x2b);
      if (bVar14 == 0x2b) {
        bVar26 = false;
      }
      else {
        bVar26 = *pbVar13 == 0x2d;
        pbVar13 = pbVar13 + bVar26;
      }
      bVar14 = *pbVar13;
      if ((byte)(bVar14 - 0x30) < 10) {
        pbVar13 = pbVar13 + 1;
        iVar11 = bVar14 - 0x30;
        if (bVar26) {
          if (0 < iVar21) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar14 = *pbVar13;
          if ((byte)(bVar14 - 0x30) < 10) {
            do {
              iVar11 = (bVar14 - 0x30) + iVar11 * 10;
              if ((iVar21 + 0x7ffffff7) / 10 < iVar11) {
                do {
                  pbVar23 = pbVar13 + 1;
                  pbVar13 = pbVar13 + 1;
                } while ((byte)(*pbVar23 - 0x30) < 10);
              }
              else {
                pbVar13 = pbVar13 + 1;
              }
              bVar14 = *pbVar13;
            } while ((byte)(bVar14 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar14 = *pbVar13;
            bVar18 = bVar14 - 0x30;
            if (9 < bVar18) goto LAB_0010255d;
            pbVar13 = pbVar13 + 1;
            iVar11 = (bVar14 - 0x30) + iVar11 * 10;
          } while (iVar11 <= 0x134 - iVar21);
          ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
LAB_0010255d:
          if (bVar18 < 10) {
            bVar26 = false;
            goto LAB_00102593;
          }
        }
        iVar9 = -iVar11;
        if (!bVar26) {
          iVar9 = iVar11;
        }
        iVar11 = iVar9;
        bVar26 = true;
      }
      else {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        bVar26 = false;
        iVar11 = 0;
      }
LAB_00102593:
      if (!bVar26) goto LAB_001027fb;
      auVar5._8_8_ = in_XMM4_Qb;
      auVar5._0_8_ = in_XMM4_Qa;
      auVar28 = vcvtusi2sd_avx512f(auVar5,uVar22);
      auVar27._0_8_ = (ulong)bVar7 * auVar27._0_8_ + (ulong)!bVar7 * auVar28._0_8_;
      auVar27._8_8_ = auVar28._8_8_;
      bVar7 = bVar8;
    }
    else {
      bVar14 = *pbVar13;
      pbVar13 = pbVar13 + (bVar14 == 0x45);
      iVar11 = 0;
      if (bVar14 == 0x45) goto LAB_0010241d;
    }
    if (bVar7) {
      uVar24 = iVar11 + iVar21;
      dVar32 = auVar27._0_8_;
      if ((int)uVar24 < -0x134) {
        dVar29 = 0.0;
        uVar30 = 0;
        if (-0x269 < (int)uVar24) {
          if (0x134 < -uVar24 - 0x134) goto LAB_001028fb;
          dVar29 = (dVar32 / 1e+308) /
                   *(double *)(internal::Pow10(int)::e + (ulong)(-uVar24 - 0x134) * 8);
          uVar30 = auVar27._8_8_;
        }
      }
      else if ((int)uVar24 < 0) {
        if (0x134 < -uVar24) goto LAB_001028fb;
        dVar29 = dVar32 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar24 * 8);
        uVar30 = auVar27._8_8_;
      }
      else {
        if (0x134 < uVar24) {
LAB_001028fb:
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        dVar29 = dVar32 * *(double *)(internal::Pow10(int)::e + (ulong)uVar24 * 8);
        uVar30 = 0;
      }
      if (dVar29 <= 1.79769313486232e+308) {
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        auVar6._8_8_ = uVar30;
        auVar6._0_8_ = dVar29;
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar28 = vxorpd_avx512vl(auVar6,auVar4);
        (pGVar12->data_).n = (Number)0x0;
        (pGVar12->data_).s.str = (Ch *)0x0;
        (pGVar12->data_).n =
             (Number)((ulong)(CVar1 == '-') * auVar28._0_8_ + (ulong)(CVar1 != '-') * (long)dVar29);
        (pGVar12->data_).f.flags = 0x216;
        bVar10 = true;
        bVar7 = false;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x6ab,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar19;
        bVar7 = true;
        bVar10 = true;
      }
    }
    else {
      if (bVar10) {
        if (CVar1 != '-') {
          pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar12->data_).n = (Number)0x0;
          (pGVar12->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar12->data_ = uVar17;
          uVar15 = (ushort)((uVar17 & 0xffffffff80000000) == 0) * 0x20 + 0x116 +
                   ((ushort)(uVar17 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar17) << 7);
LAB_00102737:
          (pGVar12->data_).f.flags = uVar15;
          goto LAB_0010273b;
        }
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(handler,-uVar17);
      }
      else {
        if (CVar1 != '-') {
          pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar12->data_).n = (Number)0x0;
          (pGVar12->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar12->data_ = (ulong)uVar25;
          uVar15 = (ushort)(-1 < (int)uVar25) << 5 | 0x1d6;
          goto LAB_00102737;
        }
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).n = (Number)0x0;
        (pGVar12->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar12->data_ = (long)(int)-uVar25;
        uVar15 = 0xb6;
        if ((int)uVar25 < 1) {
          uVar15 = 0x1f6;
        }
        (pGVar12->data_).f.flags = uVar15;
LAB_0010273b:
        bVar10 = true;
      }
      bVar7 = false;
    }
    if ((bVar7) || (bVar10 != false)) goto LAB_001027fb;
    ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this);
  }
LAB_001028d3:
  *(long *)(this + 0x38) = lVar19;
LAB_001027fb:
  is->src_ = pbVar13;
  is->head_ = pCVar3;
  return;
}

Assistant:

Ch Peek() const { return *src_; }